

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::short_level_formatter::format
          (short_level_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  string_view_t txt;
  char *__str;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *dest_00;
  string_view_t view;
  undefined1 local_60 [8];
  scoped_pad p;
  string_view_t level_name;
  memory_buffer *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  short_level_formatter *this_local;
  
  __str = level::to_short_c_str(msg->level);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&p.spaces_._M_str,__str);
  dest_00 = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
            &(this->super_flag_formatter).padinfo_;
  txt._M_str = (char *)level_name._M_len;
  txt._M_len = (size_t)p.spaces_._M_str;
  scoped_pad::scoped_pad((scoped_pad *)local_60,txt,(padding_info *)dest_00,dest);
  view._M_str = (char *)dest;
  view._M_len = level_name._M_len;
  fmt_helper::append_string_view<500ul>((fmt_helper *)p.spaces_._M_str,view,dest_00);
  scoped_pad::~scoped_pad((scoped_pad *)local_60);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        string_view_t level_name{level::to_short_c_str(msg.level)};
        scoped_pad p(level_name, padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }